

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::computeStd140Layout
               (UniformLayout *layout,ShaderInterface *interface)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 newFlags;
  UniformBlock *this;
  char *pcVar4;
  size_type sVar5;
  size_type sVar6;
  VarType *type;
  int local_1f8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  int local_134;
  reference pvStack_130;
  int uniformNdx;
  BlockLayoutEntry *blockEntry;
  int local_e8;
  int local_e4;
  int instanceNdx;
  int numInstances;
  int blockSize;
  int uniformIndicesEnd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  reference local_b0;
  Uniform *uniform;
  __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
  local_a0;
  ConstIterator uniformIter;
  int firstUniformNdx;
  int activeBlockNdx;
  int curOffset;
  byte local_72;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string blockPrefix;
  bool hasInstanceName;
  UniformBlock *block;
  int blockNdx;
  int numUniformBlocks;
  ShaderInterface *interface_local;
  UniformLayout *layout_local;
  
  iVar2 = ShaderInterface::getNumUniformBlocks(interface);
  for (block._0_4_ = 0; (int)block < iVar2; block._0_4_ = (int)block + 1) {
    this = ShaderInterface::getUniformBlock(interface,(int)block);
    pcVar4 = UniformBlock::getInstanceName(this);
    blockPrefix.field_2._M_local_buf[0xf] = pcVar4 != (char *)0x0;
    local_72 = 0;
    activeBlockNdx._3_1_ = 0;
    activeBlockNdx._1_1_ = 0;
    if ((bool)blockPrefix.field_2._M_local_buf[0xf]) {
      pcVar4 = UniformBlock::getBlockName(this);
      std::allocator<char>::allocator();
      local_72 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar4,&local_71);
      activeBlockNdx._3_1_ = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     &local_70,".");
    }
    else {
      std::allocator<char>::allocator();
      activeBlockNdx._1_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,"",(allocator<char> *)((long)&activeBlockNdx + 2));
    }
    if ((activeBlockNdx._1_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&activeBlockNdx + 2));
    }
    if ((activeBlockNdx._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator(&local_71);
    }
    firstUniformNdx = 0;
    sVar5 = std::
            vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
            ::size(&layout->blocks);
    sVar6 = std::
            vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
            ::size(&layout->uniforms);
    uniformIter._M_current._4_4_ = (int)sVar6;
    local_a0._M_current = (Uniform *)UniformBlock::begin(this);
    while( true ) {
      uniform = (Uniform *)UniformBlock::end(this);
      bVar1 = __gnu_cxx::operator!=
                        (&local_a0,
                         (__normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
                          *)&uniform);
      if (!bVar1) break;
      local_b0 = __gnu_cxx::
                 __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
                 ::operator*(&local_a0);
      pcVar4 = Uniform::getName(local_b0);
      std::operator+(&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     pcVar4);
      type = Uniform::getType(local_b0);
      dVar3 = UniformBlock::getFlags(this);
      newFlags = Uniform::getFlags(local_b0);
      dVar3 = mergeLayoutFlags(dVar3,newFlags);
      computeStd140Layout(layout,&firstUniformNdx,(int)sVar5,&local_d0,type,dVar3);
      std::__cxx11::string::~string((string *)&local_d0);
      _blockSize = __gnu_cxx::
                   __normal_iterator<const_deqp::gls::ub::Uniform_*,_std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>_>
                   ::operator++(&local_a0,0);
    }
    sVar5 = std::
            vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
            ::size(&layout->uniforms);
    numInstances = (int)sVar5;
    instanceNdx = firstUniformNdx;
    bVar1 = UniformBlock::isArray(this);
    if (bVar1) {
      local_1f8 = UniformBlock::getArraySize(this);
    }
    else {
      local_1f8 = 1;
    }
    local_e4 = local_1f8;
    for (local_e8 = 0; local_e8 < local_e4; local_e8 = local_e8 + 1) {
      BlockLayoutEntry::BlockLayoutEntry((BlockLayoutEntry *)&blockEntry);
      std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ::push_back(&layout->blocks,(value_type *)&blockEntry);
      BlockLayoutEntry::~BlockLayoutEntry((BlockLayoutEntry *)&blockEntry);
      pvStack_130 = std::
                    vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                    ::back(&layout->blocks);
      pcVar4 = UniformBlock::getBlockName(this);
      std::__cxx11::string::operator=((string *)pvStack_130,pcVar4);
      pvStack_130->size = instanceNdx;
      for (local_134 = uniformIter._M_current._4_4_; local_134 < numInstances;
          local_134 = local_134 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pvStack_130->activeUniformIndices,&local_134);
      }
      bVar1 = UniformBlock::isArray(this);
      if (bVar1) {
        de::toString<int>(&local_198,&local_e8);
        std::operator+(&local_178,"[",&local_198);
        std::operator+(&local_158,&local_178,"]");
        std::__cxx11::string::operator+=((string *)pvStack_130,(string *)&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void computeStd140Layout (UniformLayout& layout, const ShaderInterface& interface)
{
	// \todo [2012-01-23 pyry] Uniforms in default block.

	int numUniformBlocks = interface.getNumUniformBlocks();

	for (int blockNdx = 0; blockNdx < numUniformBlocks; blockNdx++)
	{
		const UniformBlock&	block			= interface.getUniformBlock(blockNdx);
		bool				hasInstanceName	= block.getInstanceName() != DE_NULL;
		std::string			blockPrefix		= hasInstanceName ? (std::string(block.getBlockName()) + ".") : std::string("");
		int					curOffset		= 0;
		int					activeBlockNdx	= (int)layout.blocks.size();
		int					firstUniformNdx	= (int)layout.uniforms.size();

		for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
		{
			const Uniform& uniform = *uniformIter;
			computeStd140Layout(layout, curOffset, activeBlockNdx, blockPrefix + uniform.getName(), uniform.getType(), mergeLayoutFlags(block.getFlags(), uniform.getFlags()));
		}

		int	uniformIndicesEnd	= (int)layout.uniforms.size();
		int	blockSize			= curOffset;
		int	numInstances		= block.isArray() ? block.getArraySize() : 1;

		// Create block layout entries for each instance.
		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			// Allocate entry for instance.
			layout.blocks.push_back(BlockLayoutEntry());
			BlockLayoutEntry& blockEntry = layout.blocks.back();

			blockEntry.name = block.getBlockName();
			blockEntry.size = blockSize;

			// Compute active uniform set for block.
			for (int uniformNdx = firstUniformNdx; uniformNdx < uniformIndicesEnd; uniformNdx++)
				blockEntry.activeUniformIndices.push_back(uniformNdx);

			if (block.isArray())
				blockEntry.name += "[" + de::toString(instanceNdx) + "]";
		}
	}
}